

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signed.cpp
# Opt level: O1

sc_signed * sc_dt::operator&(sc_signed *__return_storage_ptr__,sc_unsigned *u,int64 v)

{
  small_type us;
  bool bVar1;
  sc_length_param *psVar2;
  ulong uVar3;
  ulong uVar4;
  small_type vs;
  bool bVar5;
  sc_digit vd [3];
  
  us = u->sgn;
  if (v == 0 || us == 0) {
    psVar2 = sc_context<sc_dt::sc_length_param>::default_value();
    sc_signed::sc_signed(__return_storage_ptr__,psVar2->m_len);
  }
  else {
    vs = 1;
    if ((v < 1) && (vs = 0, v != 0)) {
      vs = -1;
      v = -v;
    }
    if (v == 0) {
      bVar5 = true;
      uVar4 = 0;
    }
    else {
      uVar3 = 0;
      do {
        vd[uVar3] = (uint)v & 0x3fffffff;
        uVar4 = uVar3 + 1;
        bVar5 = uVar3 < 2;
        if (!bVar5) break;
        bVar1 = 0x3fffffff < (ulong)v;
        v = (ulong)v >> 0x1e;
        uVar3 = uVar4;
      } while (bVar1);
    }
    if (bVar5) {
      memset(vd + (uVar4 & 0xffffffff),0,(ulong)(2 - (int)uVar4) * 4 + 4);
    }
    and_signed_friend(__return_storage_ptr__,us,u->nbits,u->ndigits,u->digit,vs,0x40,3,vd);
  }
  return __return_storage_ptr__;
}

Assistant:

sc_signed
operator&(const sc_unsigned& u, int64 v)
{

  if ((u.sgn == SC_ZERO) || (v == 0)) // case 1
    return sc_signed();

  CONVERT_INT64(v);

  // other cases
  return and_signed_friend(u.sgn, u.nbits, u.ndigits, u.digit,
                           vs, BITS_PER_UINT64, DIGITS_PER_UINT64, vd);

}